

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-amiga.cc
# Opt level: O1

PSpriteAmiga __thiscall
DataSourceAmiga::SpriteAmiga::split_horizontaly(SpriteAmiga *this,bool return_right)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  char in_DL;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  undefined7 in_register_00000031;
  long lVar3;
  _func_int *p_Var4;
  long lVar5;
  ulong uVar6;
  PSpriteAmiga PVar7;
  size_t res_width;
  undefined1 local_21;
  ulong local_20;
  
  lVar3 = CONCAT71(in_register_00000031,return_right);
  local_20 = *(ulong *)(lVar3 + 0x28) >> 1;
  (this->super_SpriteBase).super_Sprite._vptr_Sprite = (_func_int **)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<DataSourceAmiga::SpriteAmiga,std::allocator<DataSourceAmiga::SpriteAmiga>,unsigned_long&,unsigned_long&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &(this->super_SpriteBase).super_Sprite.super_enable_shared_from_this<Data::Sprite>,
             (SpriteAmiga **)this,(allocator<DataSourceAmiga::SpriteAmiga> *)&local_21,&local_20,
             (unsigned_long *)(lVar3 + 0x30));
  std::__shared_ptr<DataSourceAmiga::SpriteAmiga,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<DataSourceAmiga::SpriteAmiga,DataSourceAmiga::SpriteAmiga>
            ((__shared_ptr<DataSourceAmiga::SpriteAmiga,(__gnu_cxx::_Lock_policy)2> *)this,
             (SpriteAmiga *)(this->super_SpriteBase).super_Sprite._vptr_Sprite);
  p_Var1 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(lVar3 + 0x30);
  _Var2._M_pi = extraout_RDX;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    _Var2._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    uVar6 = 0;
    if (in_DL != '\0') {
      uVar6 = local_20;
    }
    lVar3 = uVar6 * 4 + *(long *)(lVar3 + 0x38);
    p_Var4 = (this->super_SpriteBase).super_Sprite._vptr_Sprite[7];
    do {
      if (local_20 != 0) {
        lVar5 = 0;
        uVar6 = 0;
        do {
          *(undefined4 *)(p_Var4 + uVar6 * 4) = *(undefined4 *)(lVar3 + uVar6 * 4);
          uVar6 = uVar6 + 1;
          lVar5 = lVar5 + -4;
        } while (local_20 != uVar6);
        p_Var4 = p_Var4 + -lVar5;
        lVar3 = lVar3 - lVar5;
      }
      lVar3 = lVar3 + local_20 * 4;
      _Var2._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)&(_Var2._M_pi)->_vptr__Sp_counted_base + 1);
    } while (_Var2._M_pi != p_Var1);
  }
  PVar7.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var2._M_pi;
  PVar7.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (PSpriteAmiga)
         PVar7.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

DataSourceAmiga::PSpriteAmiga
DataSourceAmiga::SpriteAmiga::split_horizontaly(bool return_right) {
  size_t res_width = width/2;
  PSpriteAmiga s = std::make_shared<SpriteAmiga>(res_width, height);
  uint32_t *src = reinterpret_cast<uint32_t*>(data);
  uint32_t *res = reinterpret_cast<uint32_t*>(s->data);
  if (return_right) {
    src += res_width;
  }
  for (size_t y = 0; y < height; y++) {
    for (size_t x = 0; x < res_width; x++) {
      *res++ = *src++;
    }
    src += res_width;
  }

  return s;
}